

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

void __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::initialize
          (InputParameter<3UL,_ruckig::StandardVector> *this)

{
  reference pvVar1;
  reference pvVar2;
  double dVar3;
  ulong local_18;
  size_t dof;
  InputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  for (local_18 = 0; local_18 < this->degrees_of_freedom; local_18 = local_18 + 1) {
    pvVar1 = std::array<double,_3UL>::operator[](&this->current_velocity,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::array<double,_3UL>::operator[](&this->current_acceleration,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::array<double,_3UL>::operator[](&this->target_velocity,local_18);
    *pvVar1 = 0.0;
    pvVar1 = std::array<double,_3UL>::operator[](&this->target_acceleration,local_18);
    *pvVar1 = 0.0;
    dVar3 = std::numeric_limits<double>::infinity();
    pvVar1 = std::array<double,_3UL>::operator[](&this->max_acceleration,local_18);
    *pvVar1 = dVar3;
    dVar3 = std::numeric_limits<double>::infinity();
    pvVar1 = std::array<double,_3UL>::operator[](&this->max_jerk,local_18);
    *pvVar1 = dVar3;
    pvVar2 = std::array<bool,_3UL>::operator[](&this->enabled,local_18);
    *pvVar2 = true;
  }
  return;
}

Assistant:

void initialize() {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            current_velocity[dof] = 0.0;
            current_acceleration[dof] = 0.0;
            target_velocity[dof] = 0.0;
            target_acceleration[dof] = 0.0;
            max_acceleration[dof] = std::numeric_limits<double>::infinity();
            max_jerk[dof] = std::numeric_limits<double>::infinity();
            enabled[dof] = true;
        }
    }